

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomFragmentOpTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::RandomFragmentOpCase::RandomFragmentOpCase
          (RandomFragmentOpCase *this,Context *context,char *name,char *desc,deUint32 seed)

{
  int iVar1;
  undefined4 extraout_var;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RandomFragmentOpCase_0217ee38;
  this->m_seed = seed;
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&this->m_callLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),
             context->m_testCtx->m_log);
  *(undefined8 *)((long)&this->m_refStencilBuffer + 4) = 0;
  *(undefined8 *)((long)&this->m_refRenderer + 4) = 0;
  this->m_refDepthBuffer = (TextureLevel *)0x0;
  this->m_refStencilBuffer = (TextureLevel *)0x0;
  this->m_renderer = (QuadRenderer *)0x0;
  this->m_refColorBuffer = (TextureLevel *)0x0;
  (this->m_callLogWrapper).m_enableLog = true;
  return;
}

Assistant:

RandomFragmentOpCase::RandomFragmentOpCase (Context& context, const char* name, const char* desc, deUint32 seed)
	: TestCase				(context, name, desc)
	, m_seed				(seed)
	, m_callLogWrapper		(context.getRenderContext().getFunctions(), context.getTestContext().getLog())
	, m_renderer			(DE_NULL)
	, m_refColorBuffer		(DE_NULL)
	, m_refDepthBuffer		(DE_NULL)
	, m_refStencilBuffer	(DE_NULL)
	, m_refRenderer			(DE_NULL)
	, m_iterNdx				(0)
{
	m_callLogWrapper.enableLogging(ENABLE_CALL_LOG);
}